

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzload.c
# Opt level: O0

int_fast64_t detzcode64(char *codep)

{
  int_fast64_t minval;
  int_fast64_t maxval;
  int_fast64_t halfmaxval;
  int_fast64_t one;
  ulong uStack_18;
  int i;
  uint_fast64_t result;
  char *codep_local;
  
  uStack_18 = (ulong)(int)((int)*codep & 0x7f);
  for (one._4_4_ = 1; one._4_4_ < 8; one._4_4_ = one._4_4_ + 1) {
    uStack_18 = uStack_18 << 8 | (long)(int)(uint)(byte)codep[one._4_4_];
  }
  if (((int)*codep & 0x80U) != 0) {
    uStack_18 = uStack_18 + 0x8000000000000000;
  }
  return uStack_18;
}

Assistant:

static int_fast64_t detzcode64( const char * codep )
{
    uint_fast64_t result;
    int           i;
    int_fast64_t  one = 1;
    int_fast64_t  halfmaxval = one << ( 64 - 2 );
    int_fast64_t  maxval = halfmaxval - 1 + halfmaxval;
    int_fast64_t  minval = - _PDCLIB_TWOS_COMPLEMENT - maxval;

    result = codep[ 0 ] & 0x7f;

    for ( i = 1; i < 8; ++i )
    {
        result = ( result << 8 ) | ( codep[ i ] & 0xff );
    }

    if ( codep[ 0 ] & 0x80 )
    {
        /* Do two's-complement negation even on non-two's-complement machines.
           If the result would be minval - 1, return minval.
        */
      result -= ! _PDCLIB_TWOS_COMPLEMENT && result != 0;
      result += minval;
    }

    return result;
}